

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
OneWireSimulationDataGenerator::GenerateSimulationData
          (OneWireSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  ulong uVar1;
  ulong uVar2;
  U32 delay;
  uint uVar3;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> device_ROMs;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_58;
  unsigned_long_long local_40;
  SimulationChannelDescriptor **local_38;
  
  local_38 = simulation_channels;
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  while (uVar2 < uVar1) {
    uVar3 = (uint)&this->mOneWireSimulationData;
    SimulationChannelDescriptor::Advance(uVar3);
    SimResetPacket(this);
    SimReadRom(this,0x8877665544332211);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0x37);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0xf0);
    local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long_long *)0x0;
    local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long_long *)0x0;
    local_40 = 0x8877665544332211;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
    _M_realloc_insert<unsigned_long_long>(&local_58,(iterator)0x0,&local_40);
    local_40 = 0x1122334455667788;
    if (local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      _M_realloc_insert<unsigned_long_long>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_40);
    }
    else {
      *local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x1122334455667788;
      local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    SimResetPacket(this);
    SimSearchRom(this,&local_58);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0xf);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0xf0);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0x55);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    SimMatchRom(this,0xf0e1d2c3b4a59687,false);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0x55);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0x18);
    SimResetPacket(this);
    SimulationChannelDescriptor::Advance(uVar3);
    SimWriteByte(this,0xec);
    if (this->mSimOverdrive == false) {
      SimResetPacket(this);
      SimWriteByte(this,0x3c);
      this->mSimOverdrive = true;
    }
    if (local_58.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  }
  *local_38 = &this->mOneWireSimulationData;
  return 1;
}

Assistant:

U32 OneWireSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mOneWireSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        U32 delay;
        if( mSimOverdrive == true )
            delay = 30;
        else
            delay = 250;

        mOneWireSimulationData.Advance( U32( UsToSamples( delay * 3 ) ) );
        // mSimulationSampleIndex += UsToSamples(delay * 3, true);

        SimResetPacket();
        SimReadRom( 0x8877665544332211ull );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x37 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );

        std::vector<U64> device_ROMs;
        device_ROMs.push_back( 0x8877665544332211ull );
        device_ROMs.push_back( 0x1122334455667788ull );

        SimResetPacket();
        U64 found_device;
        found_device = SimSearchRom( device_ROMs );

        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x0F );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xF0 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );

        SimResetPacket();
        SimMatchRom( 0xF0E1D2C3B4A59687ull );


        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x55 );
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0x18 );


        SimResetPacket();
        // mSimulationSampleIndex += UsToSamples(delay, true);
        mOneWireSimulationData.Advance( U32( UsToSamples( delay ) ) );
        SimWriteByte( 0xEC );


        if( !mSimOverdrive )
        {
            SimResetPacket();
            SimOverdriveSkipRom();
        }
    }

    *simulation_channels = &mOneWireSimulationData;


    return 1; // we are retuning the size of the SimulationChannelDescriptor array.  In our case, the "array" is length 1.
}